

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

lua_CFunction lua_atpanic(lua_State *L,lua_CFunction panicf)

{
  int iVar1;
  int *piVar2;
  lua_CFunction p_Var3;
  
  piVar2 = *(int **)&L[-1].hookmask;
  iVar1 = *piVar2;
  *piVar2 = iVar1 + 1;
  if (iVar1 == 0) {
    p_Var3 = L->l_G->panic;
    L->l_G->panic = panicf;
    *piVar2 = 0;
    return p_Var3;
  }
  __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x8d,"lua_CFunction lua_atpanic(lua_State *, lua_CFunction)");
}

Assistant:

LUA_API lua_CFunction lua_atpanic (lua_State *L, lua_CFunction panicf) {
  lua_CFunction old;
  lua_lock(L);
  old = G(L)->panic;
  G(L)->panic = panicf;
  lua_unlock(L);
  return old;
}